

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNlaDebug.cpp
# Opt level: O2

double __thiscall
HSimplexNla::debugInvertResidualError
          (HSimplexNla *this,bool transposed,HVector *solution,HVector *residual)

{
  int iVar1;
  int iVar2;
  int iVar3;
  HighsLp *pHVar4;
  HighsInt *pHVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer piVar8;
  pointer pdVar9;
  pointer pdVar10;
  ulong uVar11;
  long lVar12;
  undefined7 in_register_00000031;
  ulong uVar13;
  double dVar14;
  double dVar15;
  
  pHVar4 = this->lp_;
  pHVar5 = this->basic_index_;
  iVar1 = pHVar4->num_col_;
  pdVar6 = (solution->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (residual->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = 0;
  if (0 < pHVar4->num_row_) {
    uVar11 = (ulong)(uint)pHVar4->num_row_;
  }
  if ((int)CONCAT71(in_register_00000031,transposed) == 0) {
    for (uVar13 = 0; uVar13 != uVar11; uVar13 = uVar13 + 1) {
      dVar14 = pdVar6[uVar13];
      iVar2 = pHVar5[uVar13];
      if (iVar2 < iVar1) {
        piVar8 = (pHVar4->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar3 = piVar8[(long)iVar2 + 1];
        pdVar9 = (residual->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar12 = (long)piVar8[iVar2]; lVar12 < iVar3; lVar12 = lVar12 + 1) {
          iVar2 = (pHVar4->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar12];
          pdVar9[iVar2] =
               (pHVar4->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar12] * -dVar14 + pdVar9[iVar2];
        }
      }
      else {
        pdVar7[iVar2 - iVar1] = pdVar7[iVar2 - iVar1] - dVar14;
      }
    }
  }
  else {
    for (uVar13 = 0; uVar13 != uVar11; uVar13 = uVar13 + 1) {
      iVar2 = pHVar5[uVar13];
      if (iVar2 < iVar1) {
        piVar8 = (pHVar4->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar3 = piVar8[(long)iVar2 + 1];
        pdVar9 = (solution->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar10 = (residual->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        for (lVar12 = (long)piVar8[iVar2]; lVar12 < iVar3; lVar12 = lVar12 + 1) {
          pdVar10[uVar13] =
               pdVar10[uVar13] -
               pdVar9[(pHVar4->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar12]] *
               (pHVar4->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar12];
        }
      }
      else {
        pdVar7[uVar13] = pdVar7[uVar13] - pdVar6[iVar2 - iVar1];
      }
    }
  }
  dVar14 = 0.0;
  for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
    dVar15 = ABS((residual->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar13]);
    if (dVar14 <= dVar15) {
      dVar14 = dVar15;
    }
  }
  return dVar14;
}

Assistant:

double HSimplexNla::debugInvertResidualError(const bool transposed,
                                             const HVector& solution,
                                             HVector& residual) const {
  const HighsInt num_row = this->lp_->num_row_;
  const HighsInt num_col = this->lp_->num_col_;
  const vector<HighsInt>& a_matrix_start = this->lp_->a_matrix_.start_;
  const vector<HighsInt>& a_matrix_index = this->lp_->a_matrix_.index_;
  const vector<double>& a_matrix_value = this->lp_->a_matrix_.value_;
  const HighsInt* basic_index = this->basic_index_;

  if (transposed) {
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      HighsInt iCol = basic_index[iRow];
      if (iCol < num_col) {
        for (HighsInt iEl = a_matrix_start[iCol];
             iEl < a_matrix_start[iCol + 1]; iEl++) {
          HighsInt index = a_matrix_index[iEl];
          double value = solution.array[index];
          residual.array[iRow] -= value * a_matrix_value[iEl];
        }
      } else {
        HighsInt index = iCol - num_col;
        double value = solution.array[index];
        residual.array[iRow] -= value;
      }
    }
  } else {
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      double value = solution.array[iRow];
      HighsInt iCol = basic_index[iRow];
      if (iCol < num_col) {
        for (HighsInt iEl = a_matrix_start[iCol];
             iEl < a_matrix_start[iCol + 1]; iEl++) {
          HighsInt index = a_matrix_index[iEl];
          residual.array[index] -= value * a_matrix_value[iEl];
        }
      } else {
        HighsInt index = iCol - num_col;
        residual.array[index] -= value;
      }
    }
  }

  double residual_error_norm = 0;
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    double residual_error = fabs(residual.array[iRow]);
    residual_error_norm = std::max(residual_error, residual_error_norm);
  }
  return residual_error_norm;
}